

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

unique_lock<std::recursive_mutex> trompeloeil::get_lock<void>(void)

{
  int iVar1;
  undefined8 extraout_RDX;
  unique_lock<std::recursive_mutex> *in_RDI;
  unique_lock<std::recursive_mutex> uVar2;
  
  if (get_lock<void>()::mutex == '\0') {
    iVar1 = __cxa_guard_acquire(&get_lock<void>()::mutex);
    if (iVar1 != 0) {
      get_lock<void>::buffer._24_8_ = 0;
      get_lock<void>::buffer._32_8_ = 0;
      get_lock<void>::buffer.__align = (anon_struct_8_0_00000001_for___align)0x0;
      get_lock<void>::buffer._8_8_ = 0;
      get_lock<void>::buffer._16_8_ = 1;
      get_lock<void>::mutex = (recursive_mutex *)&get_lock<void>::buffer;
      __cxa_guard_release(&get_lock<void>()::mutex);
    }
  }
  Catch::clara::std::unique_lock<std::recursive_mutex>::unique_lock(in_RDI,get_lock<void>::mutex);
  uVar2._8_8_ = extraout_RDX;
  uVar2._M_device = (mutex_type *)in_RDI;
  return uVar2;
}

Assistant:

unique_lock<std::recursive_mutex> get_lock()
  {
    // Ugly hack for lifetime of mutex. The statically allocated
    // recursive_mutex is intentionally leaked, to ensure that the
    // mutex is available and valid even if the last use is from
    // the destructor of a global object in a translation unit
    // without #include <trompeloeil.hpp>

    static aligned_storage_for<std::recursive_mutex> buffer;
    static auto mutex = new (&buffer) std::recursive_mutex;
    return unique_lock<std::recursive_mutex>{*mutex};
  }